

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synced_bcf_reader.c
# Opt level: O2

void bcf_sr_regions_destroy(bcf_sr_regions_t *reg)

{
  _region_t *__ptr;
  long lVar1;
  long lVar2;
  
  free(reg->fname);
  if (reg->itr != (hts_itr_t *)0x0) {
    hts_itr_destroy(reg->itr);
  }
  if (reg->tbx != (tbx_t *)0x0) {
    tbx_destroy(reg->tbx);
  }
  if (reg->file != (htsFile *)0x0) {
    hts_close(reg->file);
  }
  free(reg->als);
  free((reg->als_str).s);
  free((reg->line).s);
  if (reg->regs == (_region_t *)0x0) {
    __ptr = (_region_t *)0x0;
  }
  else {
    lVar1 = 0;
    for (lVar2 = 0; lVar2 < reg->nseqs; lVar2 = lVar2 + 1) {
      free(reg->seq_names[lVar2]);
      free(*(void **)((long)&reg->regs->regs + lVar1));
      lVar1 = lVar1 + 0x18;
    }
    __ptr = reg->regs;
  }
  free(__ptr);
  free(reg->seq_names);
  khash_str2int_destroy(reg->seq_hash);
  free(reg);
  return;
}

Assistant:

void bcf_sr_regions_destroy(bcf_sr_regions_t *reg)
{
    int i;
    free(reg->fname);
    if ( reg->itr ) tbx_itr_destroy(reg->itr);
    if ( reg->tbx ) tbx_destroy(reg->tbx);
    if ( reg->file ) hts_close(reg->file);
    if ( reg->als ) free(reg->als);
    if ( reg->als_str.s ) free(reg->als_str.s);
    free(reg->line.s);
    if ( reg->regs )
    {
         // free only in-memory names, tbx names are const
        for (i=0; i<reg->nseqs; i++)
        {
            free(reg->seq_names[i]);
            free(reg->regs[i].regs);
        }
    }
    free(reg->regs);
    free(reg->seq_names);
    khash_str2int_destroy(reg->seq_hash);
    free(reg);
}